

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O1

void __thiscall
Lib::
Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
::expand(Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
         *this)

{
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar1;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *pFVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  sVar5 = 8;
  if (this->_capacity != 0) {
    sVar5 = this->_capacity * 2;
  }
  if (sVar5 * 0x40 == 0) {
    pFVar2 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else {
    pFVar2 = (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
             ::operator_new(sVar5 * 0x40,0x10);
  }
  if (this->_capacity != 0) {
    uVar3 = this->_capacity;
    if (uVar3 != 0) {
      lVar6 = 8;
      lVar7 = 0x18;
      lVar8 = 0x38;
      uVar4 = 0;
      do {
        pFVar1 = this->_stack;
        *(undefined4 *)((long)(&pFVar2->numeral + -2) + lVar8) =
             *(undefined4 *)((long)(&pFVar1->numeral + -2) + lVar8);
        Kernel::IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)((long)(pFVar2->numeral)._num._val + lVar6 + -8),
                   (IntegerConstantType *)((long)(pFVar1->numeral)._num._val + lVar6 + -8));
        Kernel::IntegerConstantType::IntegerConstantType
                  ((IntegerConstantType *)((long)(pFVar2->numeral)._num._val + lVar7 + -8),
                   (IntegerConstantType *)((long)(pFVar1->numeral)._num._val + lVar7 + -8));
        *(undefined4 *)((long)(pFVar2->numeral)._num._val + lVar8 + -0x18) =
             *(undefined4 *)((long)(pFVar1->numeral)._num._val + lVar8 + -0x18);
        *(undefined8 *)((long)(&(pFVar2->numeral)._num + -1) + lVar8) =
             *(undefined8 *)((long)(&(pFVar1->numeral)._num + -1) + lVar8);
        *(undefined4 *)((long)(pFVar2->numeral)._num._val + lVar8 + -8) =
             *(undefined4 *)((long)(pFVar1->numeral)._num._val + lVar8 + -8);
        pFVar1 = this->_stack;
        mpz_clear((__mpz_struct *)((long)(pFVar1->numeral)._num._val + lVar7 + -8));
        mpz_clear((__mpz_struct *)((long)(pFVar1->numeral)._num._val + lVar6 + -8));
        uVar4 = uVar4 + 1;
        uVar3 = this->_capacity;
        lVar6 = lVar6 + 0x40;
        lVar7 = lVar7 + 0x40;
        lVar8 = lVar8 + 0x40;
      } while (uVar4 < uVar3);
    }
    pFVar1 = this->_stack;
    if (pFVar1 != (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)0x0) {
      if (uVar3 * 0x40 == 0) {
        *(undefined8 *)pFVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pFVar1;
      }
      else if (uVar3 * 0x40 < 0x41) {
        *(undefined8 *)pFVar1 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pFVar1;
      }
      else {
        operator_delete(pFVar1,0x10);
      }
    }
  }
  this->_stack = pFVar2;
  this->_cursor = pFVar2 + this->_capacity;
  this->_end = pFVar2 + sVar5;
  this->_capacity = sVar5;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }